

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::SetupMaterialProperties_3DGS_MDL5_Quake1(MDLImporter *this)

{
  uchar *puVar1;
  aiTexture *paVar2;
  aiTexture **ppaVar3;
  aiColor4D aVar4;
  _IEEESingle temp;
  aiMaterial **ppaVar5;
  aiMaterial *paVar6;
  int iMode;
  aiString szString;
  aiColor4D local_438;
  undefined4 local_428;
  aiString local_424;
  
  puVar1 = this->mBuffer;
  ppaVar5 = (aiMaterial **)operator_new__(8);
  this->pScene->mMaterials = ppaVar5;
  paVar6 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar6);
  *this->pScene->mMaterials = paVar6;
  this->pScene->mNumMaterials = 1;
  local_428 = 2;
  paVar6 = *this->pScene->mMaterials;
  aiMaterial::AddBinaryProperty(paVar6,&local_428,4,"$mat.shadingm",0,0,aiPTI_Integer);
  local_438 = (aiColor4D)ZEXT816(0);
  if ((*(int *)(puVar1 + 0x30) != 0) && (this->pScene->mNumTextures != 0)) {
    local_438 = ReplaceTextureWithColor(this,*this->pScene->mTextures);
    if ((~(uint)local_438.r & 0x7f800000) == 0 &&
        ((undefined1  [16])local_438 & (undefined1  [16])0x7fffff) != (undefined1  [16])0x0) {
      local_438.b = 1.0;
      local_438.a = 1.0;
      local_438.r = 1.0;
      local_438.g = 1.0;
      local_424.length = 0;
      local_424.data._0_2_ = local_424.data._0_2_ & 0xff00;
      memset(local_424.data + 1,0x1b,0x3ff);
      local_424.data[2] = '\0';
      local_424.data[0] = '*';
      local_424.data[1] = '0';
      local_424.length = 2;
      aiMaterial::AddProperty(paVar6,&local_424,"$tex.file",1,0);
    }
    else {
      paVar2 = *this->pScene->mTextures;
      if (paVar2 != (aiTexture *)0x0) {
        if (paVar2->pcData != (aiTexel *)0x0) {
          operator_delete__(paVar2->pcData);
        }
        operator_delete(paVar2);
      }
      ppaVar3 = this->pScene->mTextures;
      if (ppaVar3 != (aiTexture **)0x0) {
        operator_delete__(ppaVar3);
      }
      this->pScene->mTextures = (aiTexture **)0x0;
      this->pScene->mNumTextures = 0;
    }
  }
  aiMaterial::AddBinaryProperty(paVar6,&local_438,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(paVar6,&local_438,0x10,"$clr.specular",0,0,aiPTI_Float);
  aVar4 = local_438;
  local_438.g = local_438.g * 0.05;
  local_438.r = local_438.r * 0.05;
  local_438.b = aVar4.b;
  local_438.b = local_438.b * 0.05;
  local_438.a = 1.0;
  aiMaterial::AddBinaryProperty(paVar6,&local_438,0x10,"$clr.ambient",0,0,aiPTI_Float);
  return;
}

Assistant:

void MDLImporter::SetupMaterialProperties_3DGS_MDL5_Quake1( )
{
    const MDL::Header* const pcHeader = (const MDL::Header*)this->mBuffer;

    // allocate ONE material
    pScene->mMaterials    = new aiMaterial*[1];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mNumMaterials = 1;

    // setup the material's properties
    const int iMode = (int)aiShadingMode_Gouraud;
    aiMaterial* const pcHelper = (aiMaterial*)pScene->mMaterials[0];
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    aiColor4D clr;
    if (0 != pcHeader->num_skins && pScene->mNumTextures)   {
        // can we replace the texture with a single color?
        clr = this->ReplaceTextureWithColor(pScene->mTextures[0]);
        if (is_not_qnan(clr.r)) {
            delete pScene->mTextures[0];
            delete[] pScene->mTextures;

            pScene->mTextures = NULL;
            pScene->mNumTextures = 0;
        }
        else    {
            clr.b = clr.a = clr.g = clr.r = 1.0f;
            aiString szString;
            ::memcpy(szString.data,AI_MAKE_EMBEDDED_TEXNAME(0),3);
            szString.length = 2;
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }

    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

    clr.r *= 0.05f;clr.g *= 0.05f;
    clr.b *= 0.05f;clr.a  = 1.0f;
    pcHelper->AddProperty<aiColor4D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);
}